

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random_vector.hpp
# Opt level: O1

vector<signed_char,_std::allocator<signed_char>_> *
utility::random_vector<signed_char>
          (vector<signed_char,_std::allocator<signed_char>_> *__return_storage_ptr__,size_t size,
          char min,char max)

{
  pointer pcVar1;
  pointer pcVar2;
  result_type rVar3;
  long lVar4;
  uniform_int_distribution<signed_char> uniform;
  default_random_engine generator;
  uniform_int_distribution<signed_char> local_3b;
  allocator_type local_39;
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> local_38;
  
  std::vector<signed_char,_std::allocator<signed_char>_>::vector
            (__return_storage_ptr__,size,&local_39);
  local_38._M_x = 1;
  pcVar1 = (__return_storage_ptr__->super__Vector_base<signed_char,_std::allocator<signed_char>_>).
           _M_impl.super__Vector_impl_data._M_start;
  pcVar2 = (__return_storage_ptr__->super__Vector_base<signed_char,_std::allocator<signed_char>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  if (pcVar2 != pcVar1) {
    lVar4 = 0;
    local_3b._M_param._M_a = min;
    local_3b._M_param._M_b = max;
    do {
      rVar3 = std::uniform_int_distribution<signed_char>::operator()
                        (&local_3b,&local_38,&local_3b._M_param);
      pcVar1[lVar4] = rVar3;
      lVar4 = lVar4 + 1;
    } while ((long)pcVar2 - (long)pcVar1 != lVar4);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Integer> random_vector (std::size_t size, Integer min, Integer max)
    {
        std::vector<Integer> numbers(size);

        std::uniform_int_distribution<Integer> uniform(min, max);
        std::default_random_engine generator;

        std::generate_n(numbers.begin(), numbers.size(),
            [& uniform, & generator]
            {
                return uniform(generator);
            });

        return numbers;
    }